

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O0

bool __thiscall LTFlightData::DetermineAcModel(LTFlightData *this)

{
  bool bVar1;
  __type _Var2;
  logLevelTy lVar3;
  ulong uVar4;
  string *psVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  size_type sVar10;
  reference pvVar11;
  LTFlightData *in_RDI;
  double dVar12;
  string prevType;
  lock_guard<std::recursive_mutex> lock;
  positionTy *in_stack_ffffffffffffff18;
  positionTy *in_stack_ffffffffffffff20;
  deque<positionTy,_std::allocator<positionTy>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string local_38 [55];
  bool local_1;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff20,
             (mutex_type *)in_stack_ffffffffffffff18);
  std::__cxx11::string::string(local_38,(string *)&(in_RDI->statData).acTypeIcao);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)&(in_RDI->statData).acTypeIcao,(string *)&dataRefs.cslFixAcIcaoType);
    local_1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff20,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff18);
    goto LAB_001df510;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    DataRefs::GetDefaultCarIcaoType_abi_cxx11_(&dataRefs);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff20,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff18);
    if (bVar1) {
      local_1 = false;
      goto LAB_001df510;
    }
  }
  psVar5 = ModelIcaoType::getIcaoType(in_stack_ffffffffffffff48);
  std::__cxx11::string::operator=((string *)&(in_RDI->statData).acTypeIcao,(string *)psVar5);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff20,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff18);
    if (bVar1) {
      lVar3 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar3 < 2) {
        key(in_RDI);
        pcVar6 = FDKeyTy::c_str((FDKeyTy *)0x1df21e);
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
               ,0xa34,"DetermineAcModel",logINFO,
               "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, but derived %s from mdl text"
               ,pcVar6,uVar7,uVar8,uVar9);
      }
      local_1 = true;
    }
    else {
      local_1 = false;
    }
    goto LAB_001df510;
  }
  DataRefs::GetDefaultCarIcaoType_abi_cxx11_(&dataRefs);
  _Var2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (_Var2) {
    if (((in_RDI->pAc != (LTAircraft *)0x0) &&
        (bVar1 = XPMP2::Aircraft::IsOnGrnd(&in_RDI->pAc->super_Aircraft), bVar1)) &&
       (dVar12 = LTAircraft::GetSpeed_kt((LTAircraft *)0x1df35d), dVar12 <= 80.0)) {
LAB_001df45e:
      psVar5 = DataRefs::GetDefaultCarIcaoType_abi_cxx11_(&dataRefs);
      std::__cxx11::string::operator=((string *)&(in_RDI->statData).acTypeIcao,(string *)psVar5);
      local_1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff20,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffff18);
      goto LAB_001df510;
    }
    if ((in_RDI->pAc == (LTAircraft *)0x0) &&
       (sVar10 = std::deque<positionTy,_std::allocator<positionTy>_>::size
                           ((deque<positionTy,_std::allocator<positionTy>_> *)0x1df3a4), 1 < sVar10)
       ) {
      pvVar11 = std::deque<positionTy,_std::allocator<positionTy>_>::front
                          (in_stack_ffffffffffffff30);
      bVar1 = positionTy::IsOnGnd(pvVar11);
      if (bVar1) {
        pvVar11 = std::deque<positionTy,_std::allocator<positionTy>_>::operator[]
                            ((deque<positionTy,_std::allocator<positionTy>_> *)
                             in_stack_ffffffffffffff20,(size_type)in_stack_ffffffffffffff18);
        bVar1 = positionTy::IsOnGnd(pvVar11);
        if (bVar1) {
          std::deque<positionTy,_std::allocator<positionTy>_>::front(in_stack_ffffffffffffff30);
          std::deque<positionTy,_std::allocator<positionTy>_>::operator[]
                    ((deque<positionTy,_std::allocator<positionTy>_> *)in_stack_ffffffffffffff20,
                     (size_type)in_stack_ffffffffffffff18);
          dVar12 = positionTy::speed_kt(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
          if (dVar12 <= 80.0) goto LAB_001df45e;
        }
      }
    }
  }
  std::__cxx11::string::clear();
  local_1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff20,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff18);
LAB_001df510:
  std::__cxx11::string::~string(local_38);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1df52a);
  return (bool)(local_1 & 1);
}

Assistant:

bool LTFlightData::DetermineAcModel()
{
    // access guarded by a mutex
    std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

    const std::string prevType = statData.acTypeIcao;

    // Debugging model matching: If the model is fixed, then it is what it is
    if (!dataRefs.cslFixAcIcaoType.empty()) {
        statData.acTypeIcao = dataRefs.cslFixAcIcaoType;
        return statData.acTypeIcao != prevType;
    }
    
    // We don't change the a/c type if it is already something reasonable
    if (!prevType.empty() &&
        prevType != dataRefs.GetDefaultCarIcaoType())
        return false;
    
    // Try finding a CSL model by interpreting the human-readable model text
    statData.acTypeIcao = ModelIcaoType::getIcaoType(statData.mdl);
    if ( !statData.acTypeIcao.empty() )
    {
        // yea, found something by mdl!
        if (prevType != statData.acTypeIcao) {
            LOG_MSG(logINFO,ERR_NO_AC_TYPE_BUT_MDL,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    statData.acTypeIcao.c_str());
            return true;
        }
        return false;
    }
    
    // Ground vehicle maybe? Shall be on the ground then with reasonable speed
    // (The info if this _could_ be a car is delivered by the channels via
    //  the acTypeIcao, here we just validate if the dynamic situation
    //  fits a car.)
    if (prevType == dataRefs.GetDefaultCarIcaoType())
    {
        if ((pAc &&                                 // plane exists?
             pAc->IsOnGrnd() &&                     // must be on ground with reasonable speed
             pAc->GetSpeed_kt() <= MDL_CAR_MAX_TAXI) ||
            (!pAc &&                                // no plane yet:
             posDeque.size() >= 2 &&                // analyse ground status of and speed between first two positions
             posDeque.front().IsOnGnd() && posDeque[1].IsOnGnd() &&
             posDeque.front().speed_kt(posDeque[1]) <= MDL_CAR_MAX_TAXI))
        {
            // We now decide for surface vehicle
            statData.acTypeIcao = dataRefs.GetDefaultCarIcaoType();
            return statData.acTypeIcao != prevType;
        }
    }
            
    // we have no better idea than default
    statData.acTypeIcao.clear();
    return prevType != statData.acTypeIcao;
}